

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int32 gauden_alloc_acc(gauden_t *g)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  vector_t ***ppppfVar3;
  vector_t ****pppppfVar4;
  float32 ***pppfVar5;
  
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-meanreest");
  if (lVar2 != 0) {
    ppppfVar3 = alloc_acc(g,g->n_mgau);
    g->macc = ppppfVar3;
  }
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-varreest");
  if (lVar2 != 0) {
    pcVar1 = cmd_ln_get();
    lVar2 = cmd_ln_int_r(pcVar1,"-fullvar");
    if ((int)lVar2 == 1) {
      pppppfVar4 = gauden_alloc_param_full(g->n_mgau,g->n_feat,g->n_density,g->veclen);
      lVar2 = 0x50;
    }
    else {
      pppppfVar4 = (vector_t ****)alloc_acc(g,g->n_mgau);
      lVar2 = 0x48;
    }
    *(vector_t *****)((long)&g->n_feat + lVar2) = pppppfVar4;
  }
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-meanreest");
  if (lVar2 != 0) {
    pppfVar5 = (float32 ***)
               __ckd_calloc_3d__((ulong)g->n_mgau,(ulong)g->n_feat,(ulong)g->n_density,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                 ,0x265);
    g->dnom = pppfVar5;
  }
  return 0;
}

Assistant:

int32
gauden_alloc_acc(gauden_t *g)
{
    if (cmd_ln_boolean("-meanreest") == TRUE) {
	g->macc = alloc_acc(g, g->n_mgau);
    }
    if (cmd_ln_boolean("-varreest") == TRUE) {
	if (cmd_ln_int32("-fullvar") == TRUE)
	    g->fullvacc = alloc_acc_full(g, g->n_mgau);
	else
	    g->vacc = alloc_acc(g, g->n_mgau);
    }
    
    if (cmd_ln_boolean("-meanreest") == TRUE) {
	g->dnom = (float32  ***) ckd_calloc_3d(g->n_mgau,
					       g->n_feat,
					       g->n_density,
					       sizeof(float32));
    }
    
    return S3_SUCCESS;
}